

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool __thiscall
Assimp::PLY::DOM::ParseElementInstanceLists
          (DOM *this,IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
          PLYImporter *loader)

{
  bool bVar1;
  Logger *pLVar2;
  size_type __new_size;
  reference pEVar3;
  reference pEVar4;
  __normal_iterator<Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
  local_48;
  __normal_iterator<Assimp::PLY::ElementInstanceList_*,_std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>_>
  local_40;
  iterator a;
  __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
  local_30;
  const_iterator i;
  PLYImporter *loader_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *streamBuffer_local;
  DOM *this_local;
  
  i._M_current = (Element *)loader;
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"PLY::DOM::ParseElementInstanceLists() begin");
  __new_size = std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::size
                         (&this->alElements);
  std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>::
  resize(&this->alElementData,__new_size);
  a._M_current = (ElementInstanceList *)
                 std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::begin
                           (&this->alElements);
  __gnu_cxx::
  __normal_iterator<Assimp::PLY::Element_const*,std::vector<Assimp::PLY::Element,std::allocator<Assimp::PLY::Element>>>
  ::__normal_iterator<Assimp::PLY::Element*>
            ((__normal_iterator<Assimp::PLY::Element_const*,std::vector<Assimp::PLY::Element,std::allocator<Assimp::PLY::Element>>>
              *)&local_30,
             (__normal_iterator<Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
              *)&a);
  local_40._M_current =
       (ElementInstanceList *)
       std::
       vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>::
       begin(&this->alElementData);
  do {
    local_48._M_current =
         (Element *)
         std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::end
                   (&this->alElements);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_48);
    if (!bVar1) {
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"PLY::DOM::ParseElementInstanceLists() succeeded");
      return true;
    }
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
             ::operator*(&local_30);
    if (pEVar3->eSemantic == EEST_Vertex) {
LAB_0075a572:
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_30);
      ElementInstanceList::ParseInstanceList
                (streamBuffer,buffer,pEVar3,(ElementInstanceList *)0x0,(PLYImporter *)i._M_current);
    }
    else {
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_30);
      if (pEVar3->eSemantic == EEST_Face) goto LAB_0075a572;
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_30);
      if (pEVar3->eSemantic == EEST_TriStrip) goto LAB_0075a572;
      pEVar4 = __gnu_cxx::
               __normal_iterator<Assimp::PLY::ElementInstanceList_*,_std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>_>
               ::operator*(&local_40);
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_30);
      std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>::
      resize(&pEVar4->alInstances,(ulong)pEVar3->NumOccur);
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_30);
      pEVar4 = __gnu_cxx::
               __normal_iterator<Assimp::PLY::ElementInstanceList_*,_std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>_>
               ::operator*(&local_40);
      ElementInstanceList::ParseInstanceList(streamBuffer,buffer,pEVar3,pEVar4,(PLYImporter *)0x0);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
    ::operator++(&local_30);
    __gnu_cxx::
    __normal_iterator<Assimp::PLY::ElementInstanceList_*,_std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

bool PLY::DOM::ParseElementInstanceLists(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer, PLYImporter* loader)
{
    ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceLists() begin");
  alElementData.resize(alElements.size());

  std::vector<PLY::Element>::const_iterator i = alElements.begin();
  std::vector<PLY::ElementInstanceList>::iterator a = alElementData.begin();

  // parse all element instances
  //construct vertices and faces
  for (; i != alElements.end(); ++i, ++a)
  {
    if ((*i).eSemantic == EEST_Vertex || (*i).eSemantic == EEST_Face || (*i).eSemantic == EEST_TriStrip)
    {
      PLY::ElementInstanceList::ParseInstanceList(streamBuffer, buffer, &(*i), NULL, loader);
    }
    else
    {
      (*a).alInstances.resize((*i).NumOccur);
      PLY::ElementInstanceList::ParseInstanceList(streamBuffer, buffer, &(*i), &(*a), NULL);
    }
  }

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceLists() succeeded");
  return true;
}